

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

PackageSymbol * __thiscall
slang::ast::Compilation::createPackage
          (Compilation *this,Scope *scope,ModuleDeclarationSyntax *syntax)

{
  flat_hash_map<const_syntax::SyntaxNode_*,_SyntaxMetadata> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  undefined4 uVar4;
  group_type_pointer pgVar5;
  value_type_pointer ppVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  byte bVar11;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *this_00;
  bool bVar12;
  ulong uVar13;
  NetType *defaultNetType;
  uint64_t hash;
  Diagnostic *this_01;
  value_type_pointer __y;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  string_view *sv;
  value_type_pointer ppVar19;
  PackageSymbol *pPVar20;
  uchar uVar21;
  uchar uVar23;
  uchar uVar24;
  byte bVar25;
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  SourceRange sourceRange;
  try_emplace_args_t local_d9;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *local_d8;
  PackageSymbol *local_d0;
  Scope *local_c8;
  PackageSymbol *local_c0;
  ModuleDeclarationSyntax *local_b8;
  Compilation *local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  uint64_t local_88;
  locator res;
  
  arrays_ = &this->syntaxMetadata;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = syntax;
  uVar15 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar13 = uVar15 >> ((byte)(this->syntaxMetadata).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar15 & 0xff];
  ppVar19 = (this->syntaxMetadata).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
            .arrays.elements_;
  local_d8 = (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
             (this->syntaxMetadata).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
             .arrays.groups_size_mask;
  uVar14 = 0;
  uVar17 = uVar13;
  do {
    pgVar2 = (this->syntaxMetadata).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
             .arrays.groups_ + uVar17;
    bVar11 = pgVar2->m[0xf].n;
    uVar21 = (uchar)uVar4;
    auVar26[0] = -(pgVar2->m[0].n == uVar21);
    uVar23 = (uchar)((uint)uVar4 >> 8);
    auVar26[1] = -(pgVar2->m[1].n == uVar23);
    uVar24 = (uchar)((uint)uVar4 >> 0x10);
    auVar26[2] = -(pgVar2->m[2].n == uVar24);
    bVar25 = (byte)((uint)uVar4 >> 0x18);
    auVar26[3] = -(pgVar2->m[3].n == bVar25);
    auVar26[4] = -(pgVar2->m[4].n == uVar21);
    auVar26[5] = -(pgVar2->m[5].n == uVar23);
    auVar26[6] = -(pgVar2->m[6].n == uVar24);
    auVar26[7] = -(pgVar2->m[7].n == bVar25);
    auVar26[8] = -(pgVar2->m[8].n == uVar21);
    auVar26[9] = -(pgVar2->m[9].n == uVar23);
    auVar26[10] = -(pgVar2->m[10].n == uVar24);
    auVar26[0xb] = -(pgVar2->m[0xb].n == bVar25);
    auVar26[0xc] = -(pgVar2->m[0xc].n == uVar21);
    auVar26[0xd] = -(pgVar2->m[0xd].n == uVar23);
    auVar26[0xe] = -(pgVar2->m[0xe].n == uVar24);
    auVar26[0xf] = -(bVar11 == bVar25);
    for (uVar18 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
        local_d0 = (PackageSymbol *)syntax, local_b8 = syntax, uVar18 != 0;
        uVar18 = uVar18 - 1 & uVar18) {
      uVar8 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      if ((ModuleDeclarationSyntax *)ppVar19[uVar17 * 0xf + (ulong)uVar8].first == syntax) {
        ppVar19 = ppVar19 + uVar17 * 0xf + (ulong)uVar8;
        goto LAB_0013b547;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7] & bVar11) == 0) break;
    lVar16 = uVar17 + uVar14;
    uVar14 = uVar14 + 1;
    uVar17 = lVar16 + 1U & (ulong)local_d8;
  } while (uVar14 <= local_d8);
  if ((this->syntaxMetadata).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
      .size_ctrl.size <
      (this->syntaxMetadata).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                     *)arrays_,(arrays_type *)arrays_,uVar13,uVar15,&local_d9,
               (SyntaxNode **)&local_d0);
    psVar1 = &(this->syntaxMetadata).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
    ppVar19 = res.p;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                     *)arrays_,uVar15,&local_d9,(SyntaxNode **)&local_d0);
    ppVar19 = res.p;
  }
LAB_0013b547:
  defaultNetType = (ppVar19->second).defaultNetType;
  if (defaultNetType == (NetType *)0x0) {
    defaultNetType = Scope::getDefaultNetType(scope);
    (ppVar19->second).defaultNetType = defaultNetType;
  }
  local_d0 = PackageSymbol::fromSyntax
                       (scope,local_b8,defaultNetType,
                        (optional<slang::TimeScale>)
                        ((uint5)*(uint *)&(ppVar19->second).timeScale.
                                          super__Optional_base<slang::TimeScale,_true,_true>.
                                          _M_payload.super__Optional_payload_base<slang::TimeScale>.
                                          _M_engaged << 0x20 |
                        (uint5)(uint)(ppVar19->second).timeScale.
                                     super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                                     super__Optional_payload_base<slang::TimeScale>._M_payload));
  local_d8 = (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)&this->packageMap;
  sv = &(local_d0->super_Symbol).name;
  local_c0 = local_d0;
  hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                   ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)local_d8,sv
                   );
  this_00 = local_d8;
  uVar14 = hash >> ((byte)(this->packageMap).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
                          .arrays.groups_size_index & 0x3f);
  lVar16 = (hash & 0xff) * 4;
  uVar21 = (&UNK_00461acc)[lVar16];
  uVar23 = (&UNK_00461acd)[lVar16];
  uVar24 = (&UNK_00461ace)[lVar16];
  bVar11 = (&UNK_00461acf)[lVar16];
  uVar17 = (ulong)((uint)hash & 7);
  uVar13 = 0;
  uVar15 = uVar14;
  do {
    pgVar5 = (this->packageMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
             .arrays.groups_;
    pgVar3 = pgVar5 + uVar14;
    bVar25 = pgVar3->m[0xf].n;
    auVar22[0] = -(pgVar3->m[0].n == uVar21);
    auVar22[1] = -(pgVar3->m[1].n == uVar23);
    auVar22[2] = -(pgVar3->m[2].n == uVar24);
    auVar22[3] = -(pgVar3->m[3].n == bVar11);
    auVar22[4] = -(pgVar3->m[4].n == uVar21);
    auVar22[5] = -(pgVar3->m[5].n == uVar23);
    auVar22[6] = -(pgVar3->m[6].n == uVar24);
    auVar22[7] = -(pgVar3->m[7].n == bVar11);
    auVar22[8] = -(pgVar3->m[8].n == uVar21);
    auVar22[9] = -(pgVar3->m[9].n == uVar23);
    auVar22[10] = -(pgVar3->m[10].n == uVar24);
    auVar22[0xb] = -(pgVar3->m[0xb].n == bVar11);
    auVar22[0xc] = -(pgVar3->m[0xc].n == uVar21);
    auVar22[0xd] = -(pgVar3->m[0xd].n == uVar23);
    auVar22[0xe] = -(pgVar3->m[0xe].n == uVar24);
    auVar22[0xf] = -(bVar25 == bVar11);
    uVar18 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
    if (uVar18 != 0) {
      ppVar6 = (this->packageMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
               .arrays.elements_;
      local_c8 = scope;
      local_b0 = this;
      local_a8 = uVar15;
      local_a0 = uVar14;
      local_98 = uVar13;
      local_90 = uVar17;
      local_88 = hash;
      do {
        uVar8 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        __y = ppVar6 + uVar14 * 0xf + (ulong)uVar8;
        bVar12 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           (this_00,sv,&__y->first);
        this = local_b0;
        pPVar20 = local_c0;
        if (bVar12) {
          if ((sv->_M_len != 0) && (local_c8->thisSym->kind == CompilationUnit)) {
            this_01 = Scope::addDiag(local_c8,(DiagCode)0x2a000a,(local_c0->super_Symbol).location);
            Diagnostic::operator<<(this_01,(pPVar20->super_Symbol).name);
            Diagnostic::addNote(this_01,(DiagCode)0xa0001,(__y->second->super_Symbol).location);
          }
          goto LAB_0013b77c;
        }
        uVar18 = uVar18 - 1 & uVar18;
      } while (uVar18 != 0);
      bVar25 = pgVar5[uVar14].m[0xf].n;
      uVar17 = local_90;
      scope = local_c8;
      uVar13 = local_98;
      uVar14 = local_a0;
      hash = local_88;
      uVar15 = local_a8;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar17] & bVar25) == 0) break;
    uVar7 = (this->packageMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
            .arrays.groups_size_mask;
    lVar16 = uVar14 + uVar13;
    uVar13 = uVar13 + 1;
    uVar14 = lVar16 + 1U & uVar7;
  } while (uVar13 <= uVar7);
  if ((this->packageMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
      .size_ctrl.size <
      (this->packageMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::PackageSymbol*>
              ((locator *)&res,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
                *)local_d8,(arrays_type *)local_d8,uVar15,hash,&local_d9,sv,&local_d0);
    psVar1 = &(this->packageMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
    pPVar20 = local_c0;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::PackageSymbol*>
              ((locator *)&res,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
                *)local_d8,hash,&local_d9,sv,&local_d0);
    pPVar20 = local_c0;
  }
LAB_0013b77c:
  uVar10 = *(undefined8 *)&pPVar20->timeScale;
  sourceRange = parsing::Token::range(&((local_b8->header).ptr)->name);
  checkElemTimeScale(this,(_Optional_base<slang::TimeScale,_true,_true>)SUB85(uVar10,0),sourceRange)
  ;
  return pPVar20;
}

Assistant:

const PackageSymbol& Compilation::createPackage(const Scope& scope,
                                                const ModuleDeclarationSyntax& syntax) {
    SLANG_ASSERT(!isFrozen());

    auto& metadata = syntaxMetadata[&syntax];
    if (!metadata.defaultNetType)
        metadata.defaultNetType = &scope.getDefaultNetType();

    auto& package = PackageSymbol::fromSyntax(scope, syntax, *metadata.defaultNetType,
                                              metadata.timeScale);

    auto [it, inserted] = packageMap.emplace(package.name, &package);
    if (!inserted && !package.name.empty() &&
        scope.asSymbol().kind == SymbolKind::CompilationUnit) {
        auto& diag = scope.addDiag(diag::Redefinition, package.location);
        diag << package.name;
        diag.addNote(diag::NotePreviousDefinition, it->second->location);
    }

    checkElemTimeScale(package.timeScale, syntax.header->name.range());

    return package;
}